

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.h
# Opt level: O3

void lumeview::MessageQueue::
     post<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
               (SubsetInfoAnnex **args,uint *args_1,bool *args_2,bool *args_3)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  SubsetInfoAnnex *pSVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<const_lumeview::Message> local_30;
  
  local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001dc050;
  local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi + 1);
  pSVar4 = *args;
  uVar3 = *args_1;
  bVar1 = *args_2;
  bVar2 = *args_3;
  local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Message_001dc0c8;
  *(bool *)&local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[1]._M_use_count = bVar2;
  *(bool *)((long)&local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[1]._M_use_count + 1) = bVar1;
  local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_weak_count = uVar3;
  local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._vptr__Sp_counted_base = (_func_int **)pSVar4;
  post(&local_30);
  if (local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

static void post (TArgs&&... args)
	{
		post (std::make_shared <TMsg> (std::forward<TArgs>(args)...));
	}